

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableMatrixCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *blockContentGenerator)

{
  MatrixOrder MVar1;
  Program *this;
  Shader *this_00;
  Node *ptr;
  StorageQualifier *this_01;
  TestCaseGroup *this_02;
  LayoutQualifier *this_03;
  InterfaceBlock *this_04;
  long lVar2;
  SharedPtr parentStructure;
  SharedPtr buffer;
  Layout layout;
  SharedPtr defaultBlock;
  SharedPtr shader;
  SharedPtr program;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_40;
  
  this = (Program *)operator_new(0x28);
  ResourceDefinition::Program::Program(this,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&program,(Node *)this);
  this_00 = (Shader *)operator_new(0x28);
  ResourceDefinition::Shader::Shader(this_00,&program,SHADERTYPE_COMPUTE,glslVersion);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&shader,(Node *)this_00);
  ptr = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)ptr,&shader);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&defaultBlock,ptr);
  this_01 = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(this_01,&defaultBlock,STORAGE_BUFFER);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&buffer,(Node *)this_01);
  for (lVar2 = 0x14; lVar2 != 0xa4; lVar2 = lVar2 + 0x18) {
    parentStructure.m_ptr = buffer.m_ptr;
    parentStructure.m_state = buffer.m_state;
    if (buffer.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    this_02 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (this_02,context,*(char **)((long)&PTR_typeinfo_name_01e5c408 + lVar2 + 4),
               *(char **)((long)&PTR_typeinfo_01e5c410 + lVar2 + 4));
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this_02);
    MVar1 = *(MatrixOrder *)
             ((long)&generateBufferVariableMatrixCaseBlocks::children[0].name + lVar2);
    if (MVar1 != MATRIXORDER_LAST) {
      glu::Layout::Layout(&layout,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      layout.matrixOrder = MVar1;
      this_03 = (LayoutQualifier *)operator_new(0x38);
      ResourceDefinition::LayoutQualifier::LayoutQualifier(this_03,&parentStructure,&layout);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&local_40,(Node *)this_03);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::operator=(&parentStructure,&local_40);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&local_40);
    }
    this_04 = (InterfaceBlock *)operator_new(0x28);
    ResourceDefinition::InterfaceBlock::InterfaceBlock
              (this_04,&parentStructure,(bool)(&UNK_01e5c41c)[lVar2]);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&layout,(Node *)this_04);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    operator=(&parentStructure,
              (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&layout);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&layout);
    (*blockContentGenerator)
              (context,&parentStructure,(TestCaseGroup *)this_02,(bool)(&UNK_01e5c41d)[lVar2]);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&parentStructure);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&buffer);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&defaultBlock);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&shader);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&program);
  return;
}

Assistant:

static void generateBufferVariableMatrixCaseBlocks (Context& context, tcu::TestCaseGroup* const targetGroup, glu::GLSLVersion glslVersion, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, bool))
{
	static const struct
	{
		const char*			name;
		const char*			description;
		bool				namedBlock;
		bool				extendedBasicTypeCases;
		glu::MatrixOrder	order;
	} children[] =
	{
		{ "named_block",				"Named uniform block",		true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block_row_major",		"Named uniform block",		true,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "named_block_col_major",		"Named uniform block",		true,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
		{ "unnamed_block",				"Unnamed uniform block",	false,	false,	glu::MATRIXORDER_LAST			},
		{ "unnamed_block_row_major",	"Unnamed uniform block",	false,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "unnamed_block_col_major",	"Unnamed uniform block",	false,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ResourceDefinition::Node::SharedPtr	program			(new ResourceDefinition::Program());
	const ResourceDefinition::Node::SharedPtr	shader			(new ResourceDefinition::Shader(program, glu::SHADERTYPE_COMPUTE, glslVersion));
	const ResourceDefinition::Node::SharedPtr	defaultBlock	(new ResourceDefinition::DefaultBlock(shader));
	const ResourceDefinition::Node::SharedPtr	buffer			(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_BUFFER));

	for (int childNdx = 0; childNdx < (int)DE_LENGTH_OF_ARRAY(children); ++childNdx)
	{
		ResourceDefinition::Node::SharedPtr	parentStructure	= buffer;
		tcu::TestCaseGroup* const			blockGroup		= new TestCaseGroup(context, children[childNdx].name, children[childNdx].description);

		targetGroup->addChild(blockGroup);

		if (children[childNdx].order != glu::MATRIXORDER_LAST)
		{
			glu::Layout layout;
			layout.matrixOrder = children[childNdx].order;
			parentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(parentStructure, layout));
		}

		parentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::InterfaceBlock(parentStructure, children[childNdx].namedBlock));

		blockContentGenerator(context, parentStructure, blockGroup, children[childNdx].extendedBasicTypeCases);
	}
}